

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighteraxe.cpp
# Opt level: O0

int AF_A_FAxeCheckUpG(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AWeapon *this;
  player_t *player_00;
  AAmmo *pAVar1;
  FState *state;
  bool bVar2;
  VMValue *local_d0;
  bool local_b2;
  bool local_af;
  undefined1 local_98 [8];
  VMValue params [3];
  player_t *local_58;
  player_t *player;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                  ,0x96,"int AF_A_FAxeCheckUpG(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_af = true;
    if (stateowner != (AActor *)0x0) {
      local_af = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_af == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                    ,0x96,"int AF_A_FAxeCheckUpG(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar2 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                      ,0x96,"int AF_A_FAxeCheckUpG(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_b2 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_b2 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_b2 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                      ,0x96,"int AF_A_FAxeCheckUpG(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar2 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                      ,0x96,"int AF_A_FAxeCheckUpG(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      player = (player_t *)pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      player = (player_t *)0x0;
    }
    local_58 = stateowner->player;
    if (local_58 != (player_t *)0x0) {
      pAVar1 = TObjPtr<AAmmo>::operator->(&local_58->ReadyWeapon->Ammo1);
      player_00 = local_58;
      if ((pAVar1->super_AInventory).Amount < 1) {
        this = local_58->ReadyWeapon;
        FName::FName((FName *)&stack0xffffffffffffffa4,"Select");
        state = AActor::FindState((AActor *)this,(FName *)&stack0xffffffffffffffa4);
        P_SetPsprite(player_00,PSP_WEAPON,state,false);
      }
      else {
        VMValue::VMValue((VMValue *)local_98,(DObject *)stateowner);
        VMValue::VMValue((VMValue *)((long)&params[0].field_0 + 8),(DObject *)stateowner);
        VMValue::VMValue((VMValue *)((long)&params[1].field_0 + 8),(void *)0x0,8);
        VMFrameStack::Call((VMFrameStack *)param_local,&A_Raise_VMPtr->super_VMFunction,
                           (VMValue *)local_98,3,(VMReturn *)0x0,0,(VMException **)0x0);
        local_d0 = (VMValue *)((long)&params[2].field_0 + 8);
        do {
          local_d0 = local_d0 + -1;
          VMValue::~VMValue(local_d0);
        } while (local_d0 != (VMValue *)local_98);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                ,0x96,"int AF_A_FAxeCheckUpG(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FAxeCheckUpG)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (nullptr == (player = self->player))
	{
		return 0;
	}
	if (player->ReadyWeapon->Ammo1->Amount <= 0)
	{
		P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->FindState ("Select"));
	}
	else
	{
		CALL_ACTION(A_Raise, self);
	}
	return 0;
}